

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

SstStatusValue SstFFSPerformGets(SstStream Stream)

{
  SstFullMetadata p_Var1;
  void *pvVar2;
  void **ppvVar3;
  long *plVar4;
  size_t start;
  size_t *SelectionCounts;
  bool bVar5;
  int iVar6;
  SstStatusValue SVar7;
  uint uVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  FFSVarRec_conflict pFVar13;
  range_list uncovered_list;
  size_t *PartialOffsets;
  size_t *GlobalDims;
  size_t *SelectionOffsets;
  FFSArrayRequest_conflict PrevReq;
  FFSArrayRequest_conflict pFVar14;
  int *piVar15;
  size_t *__ptr;
  size_t sVar16;
  size_t *psVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  undefined8 *puVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  size_t *local_170;
  size_t *local_160;
  SstStatusValue local_154;
  void *local_138 [33];
  
  p_Var1 = Stream->CurrentMetadata;
  pvVar2 = Stream->ReaderMarshalData;
  pFVar14 = *(FFSArrayRequest_conflict *)((long)pvVar2 + 0x18);
  if (pFVar14 != (FFSArrayRequest_conflict)0x0) {
    uVar24 = Stream->WriterCohortSize;
    do {
      if (0 < (int)uVar24) {
        piVar15 = *(int **)((long)pvVar2 + 0x40);
        uVar25 = 0;
        do {
          if ((*piVar15 != 1) && (iVar6 = NeedWriter(pFVar14,(int)uVar25), iVar6 != 0)) {
            *piVar15 = 1;
          }
          uVar25 = uVar25 + 1;
          piVar15 = piVar15 + 6;
        } while (uVar24 != uVar25);
      }
      pFVar14 = pFVar14->Next;
    } while (pFVar14 != (FFSArrayRequest *)0x0);
  }
  if (0 < Stream->WriterCohortSize) {
    lVar26 = 0;
    lVar21 = 0;
    do {
      if (*(int *)(*(long *)((long)pvVar2 + 0x40) + lVar26) == 1) {
        ppvVar3 = p_Var1->DP_TimestepInfo;
        if (ppvVar3 == (void **)0x0) {
          pvVar10 = (void *)0x0;
        }
        else {
          pvVar10 = ppvVar3[lVar21];
        }
        sVar16 = *(size_t *)(*(long *)(*(long *)((long)pvVar2 + 0x20) + lVar21 * 8) + 0x10);
        pvVar9 = realloc(*(void **)(*(long *)((long)pvVar2 + 0x40) + 8 + lVar26),sVar16);
        *(void **)(*(long *)((long)pvVar2 + 0x40) + 8 + lVar26) = pvVar9;
        memset(local_138,0,0x100);
        snprintf((char *)local_138,0x100,"Request to rank %d, bytes");
        if (_perfstubs_initialized == 1) {
          if (IssueReadRequests___var842 == 0) {
            IssueReadRequests___var842 = ps_create_counter_(local_138);
          }
          auVar27._8_4_ = (int)(sVar16 >> 0x20);
          auVar27._0_8_ = sVar16;
          auVar27._12_4_ = 0x45300000;
          ps_sample_counter_((auVar27._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0),
                             IssueReadRequests___var842);
        }
        pvVar10 = SstReadRemoteMemory(Stream,(int)lVar21,Stream->ReaderTimestep,0,sVar16,
                                      *(void **)(*(long *)((long)pvVar2 + 0x40) + 8 + lVar26),
                                      pvVar10);
        lVar23 = *(long *)((long)pvVar2 + 0x40);
        *(void **)(lVar23 + 0x10 + lVar26) = pvVar10;
        *(undefined4 *)(lVar23 + lVar26) = 2;
      }
      lVar21 = lVar21 + 1;
      lVar26 = lVar26 + 0x18;
    } while (lVar21 < Stream->WriterCohortSize);
  }
  bVar5 = 0 < Stream->WriterCohortSize;
  if (0 < Stream->WriterCohortSize) {
    pvVar10 = Stream->ReaderMarshalData;
    bVar5 = true;
    uVar25 = 0;
    do {
      lVar21 = *(long *)((long)pvVar10 + 0x40);
      if (*(int *)(lVar21 + uVar25 * 0x18) == 2) {
        SVar7 = SstWaitForCompletion(Stream,*(void **)(lVar21 + uVar25 * 0x18 + 0x10));
        if (SVar7 == SstSuccess) {
          *(undefined4 *)(*(long *)((long)pvVar10 + 0x40) + uVar25 * 0x18) = 3;
          if (Stream->ConfigParams->ReaderShortCircuitReads == 0) {
            pvVar9 = Stream->ReaderMarshalData;
            puVar22 = (undefined8 *)(*(long *)((long)pvVar9 + 0x40) + uVar25 * 0x18 + 8);
            uVar11 = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,*puVar22);
            iVar6 = FFShas_conversion(uVar11);
            if (iVar6 == 0) {
              uVar12 = FMContext_from_FFS(Stream->ReaderFFSContext);
              uVar12 = FMformat_from_ID(uVar12,*puVar22);
              uVar12 = format_list_of_FMFormat(uVar12);
              uVar12 = FMcopy_struct_list(uVar12);
              FMlocalize_structs(uVar12);
              establish_conversion(Stream->ReaderFFSContext,uVar11,uVar12);
              FMfree_struct_list(uVar12);
            }
            iVar6 = FFSdecode_in_place_possible(uVar11);
            if (iVar6 == 0) {
              sVar16 = FFS_est_decode_length
                                 (Stream->ReaderFFSContext,*puVar22,
                                  *(undefined8 *)
                                   (*(long *)(*(long *)((long)pvVar9 + 0x20) + uVar25 * 8) + 0x10));
              local_138[0] = malloc(sVar16);
              uVar12 = create_fixed_FFSBuffer(local_138[0],sVar16);
              FFSdecode_to_buffer(Stream->ReaderFFSContext,*puVar22,uVar12);
            }
            else {
              FFSdecode_in_place(Stream->ReaderFFSContext,*puVar22,local_138);
            }
            pcVar20 = getenv("SstDumpData");
            if (pcVar20 != (char *)0x0) {
              printf("\nOn Rank %d, IncomingDatablock from writer %d is %p :\n",
                     (ulong)(uint)Stream->Rank,uVar25 & 0xffffffff,local_138[0]);
              uVar12 = FMFormat_of_original(uVar11);
              FMdump_data(uVar12,local_138[0],0xfa000);
            }
            *(void **)(*(long *)((long)pvVar9 + 0x30) + uVar25 * 8) = local_138[0];
            uVar11 = FMFormat_of_original(uVar11);
            lVar21 = format_list_of_FMFormat(uVar11);
            plVar4 = *(long **)(lVar21 + 8);
            *(long **)(*(long *)((long)pvVar9 + 0x38) + uVar25 * 8) = plVar4;
            if (*plVar4 != 0) {
              piVar15 = (int *)((long)plVar4 + 0x14);
              do {
                pFVar13 = LookupVarByName(Stream,(char *)(*(long *)(piVar15 + 1) + 4));
                if (pFVar13 != (FFSVarRec_conflict)0x0) {
                  iVar6 = *piVar15;
                  pFVar13->PerWriterIncomingData[uVar25] =
                       *(void **)((long)local_138[0] + (long)iVar6 + 8);
                  pFVar13->PerWriterIncomingSize[uVar25] =
                       *(size_t *)((long)local_138[0] + (long)iVar6);
                }
                plVar4 = (long *)(piVar15 + 7);
                piVar15 = piVar15 + 0xc;
              } while (*plVar4 != 0);
            }
          }
        }
        else {
          CP_verbose(Stream,CriticalVerbose,
                     "Wait for remote read completion failed, returning failure\n");
          local_154 = SVar7;
        }
        if (SVar7 != SstSuccess) break;
      }
      uVar25 = uVar25 + 1;
      bVar5 = (long)uVar25 < (long)Stream->WriterCohortSize;
    } while ((long)uVar25 < (long)Stream->WriterCohortSize);
  }
  if (!bVar5) {
    local_154 = SstSuccess;
    CP_verbose(Stream,TraceVerbose,"All remote memory reads completed\n");
  }
  if (local_154 == SstSuccess) {
    if (Stream->ConfigParams->ReaderShortCircuitReads == 0) {
      for (pFVar14 = *(FFSArrayRequest_conflict *)((long)pvVar2 + 0x18);
          pFVar14 != (FFSArrayRequest_conflict)0x0; pFVar14 = pFVar14->Next) {
        if ((pFVar14->RequestType != Local) && (pFVar14->VarRec->DimCount == 1)) {
          uncovered_list = (range_list)malloc(0x18);
          uncovered_list->next = (_range_list *)0x0;
          psVar17 = pFVar14->Start;
          uncovered_list->start = *psVar17;
          uncovered_list->end = (*psVar17 + *pFVar14->Count) - 1;
          if (0 < Stream->WriterCohortSize) {
            lVar21 = 0;
            do {
              start = *pFVar14->VarRec->PerWriterStart[lVar21];
              uncovered_list =
                   OneDCoverage(start,(start + *pFVar14->VarRec->PerWriterCounts[lVar21]) - 1,
                                uncovered_list);
              lVar21 = lVar21 + 1;
            } while (lVar21 < Stream->WriterCohortSize);
          }
          if (uncovered_list != (range_list)0x0) {
            printf("WARNING:   Reader Rank %d requested elements %zu - %zu,\n\tbut these elements were not written by any writer rank: \n"
                   ,(ulong)(uint)Stream->Rank,*pFVar14->Start,*pFVar14->Start + *pFVar14->Count + -1
                  );
            DumpCoverageList(uncovered_list);
          }
        }
        if (0 < Stream->WriterCohortSize) {
          lVar21 = 0;
          do {
            iVar6 = NeedWriter(pFVar14,(int)lVar21);
            if (iVar6 != 0) {
              pFVar13 = pFVar14->VarRec;
              iVar6 = pFVar13->ElementSize;
              uVar25 = pFVar13->DimCount;
              psVar17 = pFVar13->PerWriterCounts[lVar21];
              SelectionOffsets = pFVar14->Start;
              SelectionCounts = pFVar14->Count;
              pcVar20 = (char *)pFVar13->PerWriterIncomingData[lVar21];
              uVar24 = (uint)uVar25;
              if (pFVar14->RequestType == Local) {
                if (pFVar14->BlockID == pFVar13->PerWriterBlockStart[lVar21]) {
                  lVar23 = 0;
                }
                else {
                  lVar26 = 0;
                  lVar23 = 0;
                  do {
                    lVar18 = 1;
                    if (0 < (int)uVar24) {
                      uVar19 = 0;
                      do {
                        lVar18 = lVar18 * psVar17[uVar19];
                        uVar19 = uVar19 + 1;
                      } while ((uVar24 & 0x7fffffff) != uVar19);
                    }
                    lVar23 = lVar23 + lVar18 * iVar6;
                    psVar17 = psVar17 + (int)uVar24;
                    lVar26 = lVar26 + 1;
                  } while (lVar26 != pFVar14->BlockID - pFVar13->PerWriterBlockStart[lVar21]);
                }
                sVar16 = (size_t)(int)uVar24;
                PartialOffsets = (size_t *)calloc(sVar16,8);
                GlobalDims = (size_t *)calloc(sVar16,8);
                if (SelectionOffsets == (size_t *)0x0) {
                  SelectionOffsets = (size_t *)calloc(sVar16,8);
                  local_170 = SelectionOffsets;
                }
                else {
                  local_170 = (size_t *)0x0;
                }
                if (0 < (int)uVar24) {
                  uVar25 = uVar25 & 0xffffffff;
                  do {
                    GlobalDims[lVar21] = psVar17[lVar21];
                    uVar8 = (int)uVar25 - 1;
                    uVar25 = (ulong)uVar8;
                  } while (uVar8 != 0);
                }
                pcVar20 = pcVar20 + lVar23;
                __ptr = GlobalDims;
                local_160 = PartialOffsets;
              }
              else {
                GlobalDims = pFVar13->GlobalDims;
                PartialOffsets = pFVar13->PerWriterStart[lVar21];
                __ptr = (size_t *)0x0;
                local_160 = (size_t *)0x0;
                local_170 = (size_t *)0x0;
              }
              if (Stream->ConfigParams->IsRowMajor == 0) {
                ExtractSelectionFromPartialCM
                          (iVar6,(long)(int)uVar24,GlobalDims,PartialOffsets,psVar17,
                           SelectionOffsets,SelectionCounts,pcVar20,(char *)pFVar14->Data);
              }
              else {
                ExtractSelectionFromPartialRM
                          (iVar6,(long)(int)uVar24,GlobalDims,PartialOffsets,psVar17,
                           SelectionOffsets,SelectionCounts,pcVar20,(char *)pFVar14->Data);
              }
              free(local_170);
              free(__ptr);
              free(local_160);
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < Stream->WriterCohortSize);
        }
      }
    }
  }
  else {
    CP_verbose(Stream,CriticalVerbose,
               "Some memory read failed, not filling requests and returning failure\n");
  }
  pvVar2 = Stream->ReaderMarshalData;
  pvVar10 = *(void **)((long)pvVar2 + 0x18);
  while (pvVar10 != (void *)0x0) {
    pvVar9 = *(void **)((long)pvVar10 + 0x30);
    free(*(void **)((long)pvVar10 + 0x20));
    free(*(void **)((long)pvVar10 + 0x18));
    free(pvVar10);
    pvVar10 = pvVar9;
  }
  *(undefined8 *)((long)pvVar2 + 0x18) = 0;
  return local_154;
}

Assistant:

static void IssueReadRequests(SstStream Stream, FFSArrayRequest Reqs)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    SstFullMetadata Mdata = Stream->CurrentMetadata;

    while (Reqs)
    {
        int i;
        for (i = 0; i < Stream->WriterCohortSize; i++)
        {
            if ((Info->WriterInfo[i].Status != Needed) && (NeedWriter(Reqs, i)))
            {
                Info->WriterInfo[i].Status = Needed;
            }
        }
        Reqs = Reqs->Next;
    }

    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        if (Info->WriterInfo[WriterRank].Status == Needed)
        {
            size_t DataSize = ((struct FFSMetadataInfoStruct *)Info->MetadataBaseAddrs[WriterRank])
                                  ->DataBlockSize;
            void *DP_TimestepInfo =
                Mdata->DP_TimestepInfo ? Mdata->DP_TimestepInfo[WriterRank] : NULL;
            Info->WriterInfo[WriterRank].RawBuffer =
                realloc(Info->WriterInfo[WriterRank].RawBuffer, DataSize);

            char tmpstr[256] = {0};
            snprintf(tmpstr, sizeof(tmpstr), "Request to rank %d, bytes", WriterRank);
            PERFSTUBS_SAMPLE_COUNTER(tmpstr, (double)DataSize);
            Info->WriterInfo[WriterRank].ReadHandle =
                SstReadRemoteMemory(Stream, WriterRank, Stream->ReaderTimestep, 0, DataSize,
                                    Info->WriterInfo[WriterRank].RawBuffer, DP_TimestepInfo);
            Info->WriterInfo[WriterRank].Status = Requested;
        }
    }
}